

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZDICT_finalizeDictionary
                 (void *dictBuffer,size_t dictBufferCapacity,void *customDictContent,
                 size_t dictContentSize,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                 ZDICT_params_t params)

{
  size_t __n;
  void *__dest;
  undefined1 auVar1 [16];
  XXH64_hash_t XVar2;
  size_t sVar3;
  size_t __n_00;
  int compressionLevel;
  size_t __n_01;
  BYTE header [256];
  
  compressionLevel = 3;
  if (params.compressionLevel != 0) {
    compressionLevel = params.compressionLevel;
  }
  sVar3 = 0xffffffffffffffba;
  if (0xff < dictBufferCapacity && dictContentSize <= dictBufferCapacity) {
    header[0] = '7';
    header[1] = 0xa4;
    header[2] = '0';
    header[3] = 0xec;
    XVar2 = XXH_INLINE_XXH64(customDictContent,dictContentSize,(XXH64_hash_t)customDictContent);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = XVar2;
    header._4_4_ = SUB164(auVar1 % ZEXT816(0x7fff8000),0) + 0x8000;
    if (params.dictID != 0) {
      header._4_4_ = params.dictID;
    }
    if (1 < params.notificationLevel) {
      fprintf(_stderr,"\r%70s\r","");
      fflush(_stderr);
      fwrite("statistics ... \n",0x10,1,_stderr);
      fflush(_stderr);
    }
    sVar3 = ZDICT_analyzeEntropy
                      (header + 8,0xf8,compressionLevel,samplesBuffer,samplesSizes,nbSamples,
                       customDictContent,dictContentSize,params.notificationLevel);
    if (sVar3 < 0xffffffffffffff89) {
      __n = sVar3 + 8;
      __n_00 = dictBufferCapacity - __n;
      if (dictContentSize + __n <= dictBufferCapacity) {
        __n_00 = dictContentSize;
      }
      if (__n_00 < 8) {
        if (dictBufferCapacity < sVar3 + 0x10) {
          return 0xffffffffffffffba;
        }
        __n_01 = 8 - __n_00;
      }
      else {
        __n_01 = 0;
      }
      sVar3 = __n_00 + __n + __n_01;
      if (dictBufferCapacity < sVar3) {
        __assert_fail("dictSize <= dictBufferCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cc,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      __dest = (void *)((long)((long)dictBuffer + __n) + __n_01);
      if ((long)__dest + __n_00 != (long)dictBuffer + sVar3) {
        __assert_fail("outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xc2cd,
                      "size_t ZDICT_finalizeDictionary(void *, size_t, const void *, size_t, const void *, const size_t *, unsigned int, ZDICT_params_t)"
                     );
      }
      memmove(__dest,customDictContent,__n_00);
      memcpy(dictBuffer,header,__n);
      memset((void *)((long)dictBuffer + __n),0,__n_01);
    }
  }
  return sVar3;
}

Assistant:

size_t ZDICT_finalizeDictionary(void* dictBuffer, size_t dictBufferCapacity,
                          const void* customDictContent, size_t dictContentSize,
                          const void* samplesBuffer, const size_t* samplesSizes,
                          unsigned nbSamples, ZDICT_params_t params)
{
    size_t hSize;
#define HBUFFSIZE 256   /* should prove large enough for all entropy headers */
    BYTE header[HBUFFSIZE];
    int const compressionLevel = (params.compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : params.compressionLevel;
    U32 const notificationLevel = params.notificationLevel;
    /* The final dictionary content must be at least as large as the largest repcode */
    size_t const minContentSize = (size_t)ZDICT_maxRep(repStartValue);
    size_t paddingSize;

    /* check conditions */
    DEBUGLOG(4, "ZDICT_finalizeDictionary");
    if (dictBufferCapacity < dictContentSize) return ERROR(dstSize_tooSmall);
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) return ERROR(dstSize_tooSmall);

    /* dictionary header */
    MEM_writeLE32(header, ZSTD_MAGIC_DICTIONARY);
    {   U64 const randomID = XXH64(customDictContent, dictContentSize, 0);
        U32 const compliantID = (randomID % ((1U<<31)-32768)) + 32768;
        U32 const dictID = params.dictID ? params.dictID : compliantID;
        MEM_writeLE32(header+4, dictID);
    }
    hSize = 8;

    /* entropy tables */
    DISPLAYLEVEL(2, "\r%70s\r", "");   /* clean display line */
    DISPLAYLEVEL(2, "statistics ... \n");
    {   size_t const eSize = ZDICT_analyzeEntropy(header+hSize, HBUFFSIZE-hSize,
                                  compressionLevel,
                                  samplesBuffer, samplesSizes, nbSamples,
                                  customDictContent, dictContentSize,
                                  notificationLevel);
        if (ZDICT_isError(eSize)) return eSize;
        hSize += eSize;
    }

    /* Shrink the content size if it doesn't fit in the buffer */
    if (hSize + dictContentSize > dictBufferCapacity) {
        dictContentSize = dictBufferCapacity - hSize;
    }

    /* Pad the dictionary content with zeros if it is too small */
    if (dictContentSize < minContentSize) {
        RETURN_ERROR_IF(hSize + minContentSize > dictBufferCapacity, dstSize_tooSmall,
                        "dictBufferCapacity too small to fit max repcode");
        paddingSize = minContentSize - dictContentSize;
    } else {
        paddingSize = 0;
    }

    {
        size_t const dictSize = hSize + paddingSize + dictContentSize;

        /* The dictionary consists of the header, optional padding, and the content.
         * The padding comes before the content because the "best" position in the
         * dictionary is the last byte.
         */
        BYTE* const outDictHeader = (BYTE*)dictBuffer;
        BYTE* const outDictPadding = outDictHeader + hSize;
        BYTE* const outDictContent = outDictPadding + paddingSize;

        assert(dictSize <= dictBufferCapacity);
        assert(outDictContent + dictContentSize == (BYTE*)dictBuffer + dictSize);

        /* First copy the customDictContent into its final location.
         * `customDictContent` and `dictBuffer` may overlap, so we must
         * do this before any other writes into the output buffer.
         * Then copy the header & padding into the output buffer.
         */
        memmove(outDictContent, customDictContent, dictContentSize);
        memcpy(outDictHeader, header, hSize);
        memset(outDictPadding, 0, paddingSize);

        return dictSize;
    }
}